

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O1

Result<std::shared_ptr<wasm::Module>_> * __thiscall
Shell::makeModule(Result<std::shared_ptr<wasm::Module>_> *__return_storage_ptr__,Shell *this,
                 WASTModule *mod)

{
  undefined8 *puVar1;
  __index_type _Var2;
  int iVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined1 auStack_608 [8];
  WasmBinaryReader reader;
  __index_type local_5e8;
  undefined1 *local_210;
  stringstream ss;
  undefined1 local_200;
  undefined7 uStack_1ff;
  undefined8 uStack_1f8;
  long *local_88;
  long local_78 [2];
  char local_68;
  void *local_40;
  vector<char,_std::allocator<char>_> buffer;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var2 = (mod->super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>).
          super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
          super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
          super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
          super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
          super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
          ._M_index;
  if (_Var2 == '\0') {
    auStack_608 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<wasm::Module,std::allocator<wasm::Module>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reader,(Module **)auStack_608,
               (allocator<wasm::Module> *)&local_210);
    _Var4._M_pi = _Stack_20._M_pi;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_reader;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)auStack_608;
    auStack_608 = (undefined1  [8])0x0;
    _reader = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_reader !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_reader);
    }
    iVar3 = *(int *)&(mod->
                     super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     ).
                     super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     ._M_u;
    if (iVar3 == 0) {
      local_68 = '\0';
      wasm::WATParser::parseModule
                (auStack_608,
                 buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 *(undefined8 *)
                  ((long)&(mod->
                          super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          ).
                          super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          ._M_u + 0x10),
                 *(undefined8 *)
                  ((long)&(mod->
                          super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          ).
                          super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          ._M_u + 8));
      if ((local_68 == '\x01') && (local_68 = '\0', local_88 != local_78)) {
        operator_delete(local_88,local_78[0] + 1);
      }
      if (local_5e8 == '\x01') {
        local_210 = &local_200;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,auStack_608,_reader + (long)auStack_608);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> +
                 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
          super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
          super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
          super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
          super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
          super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> = puVar1;
        if (local_210 == &local_200) {
          *puVar1 = CONCAT71(uStack_1ff,local_200);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x18) =
               uStack_1f8;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->val).
            super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> = local_210;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                            super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                            super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                            super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                            super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                            super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> +
                    0x10) = CONCAT71(uStack_1ff,local_200);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 8) = _ss;
        _ss = 0;
        local_200 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20) =
             '\x01';
        local_210 = &local_200;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_608);
        goto LAB_0012426a;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_608);
    }
    else if (iVar3 == 1) {
      __first._M_current =
           *(char **)((long)&(mod->
                             super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             ).
                             super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             .
                             super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             .
                             super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             .
                             super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             ._M_u + 8);
      std::vector<char,std::allocator<char>>::
      vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((vector<char,std::allocator<char>> *)&local_40,__first,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(__first._M_current +
                   *(long *)((long)&(mod->
                                    super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    ).
                                    super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    ._M_u + 0x10)),(allocator_type *)auStack_608);
      wasm::WasmBinaryReader::WasmBinaryReader
                ((WasmBinaryReader *)auStack_608,
                 (Module *)
                 buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(FeatureSet)0x3fffff,(vector *)&local_40,
                 (vector *)&wasm::defaultEmptySourceMap);
      wasm::WasmBinaryReader::read();
      wasm::WasmBinaryReader::~WasmBinaryReader((WasmBinaryReader *)auStack_608);
      if (local_40 != (void *)0x0) {
        operator_delete(local_40,(long)buffer.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)local_40);
      }
    }
  }
  else {
    if (_Var2 != '\x01') {
      wasm::handle_unreachable
                ("unexpected module kind",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                 ,0x78);
    }
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         *(pointer *)
          &(mod->super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>)
           .super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
           super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
           super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
           super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
           super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
           ._M_u;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_20,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(mod->
                       super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       ).
                       super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       .
                       super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       .
                       super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       .
                       super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       ._M_u + 8));
  }
  _Var4._M_pi = _Stack_20._M_pi;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage[0x178] = -1;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage[0x179] = -1;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage[0x17a] = '?';
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage[0x17b] = '\0';
  *(pointer *)
   &(__return_storage_ptr__->val).super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> =
       buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 8) = 0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 8) = _Var4._M_pi
  ;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20) = '\0';
LAB_0012426a:
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<std::shared_ptr<Module>> makeModule(WASTModule& mod) {
    std::shared_ptr<Module> wasm;
    if (auto* quoted = std::get_if<QuotedModule>(&mod)) {
      wasm = std::make_shared<Module>();
      switch (quoted->type) {
        case QuotedModuleType::Text: {
          CHECK_ERR(parseModule(*wasm, quoted->module));
          break;
        }
        case QuotedModuleType::Binary: {
          std::vector<char> buffer(quoted->module.begin(),
                                   quoted->module.end());
          WasmBinaryReader reader(*wasm, FeatureSet::All, buffer);
          try {
            reader.read();
          } catch (ParseException& p) {
            std::stringstream ss;
            p.dump(ss);
            return Err{ss.str()};
          }
          break;
        }
      }
    } else if (auto* ptr = std::get_if<std::shared_ptr<Module>>(&mod)) {
      wasm = *ptr;
    } else {
      WASM_UNREACHABLE("unexpected module kind");
    }
    wasm->features = FeatureSet::All;
    return wasm;
  }